

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void getDWTRecCoeff(double *coeff,int *length,char *ctype,char *ext,int level,int J,double *lpr,
                   double *hpr,int lf,int siglength,double *reccoeff)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  void *pvVar4;
  double *local_78;
  double *filt;
  double *X_lp;
  double *out;
  int l2;
  int t;
  int v;
  int n;
  int m;
  int l;
  int N;
  int det_len;
  int k;
  int j;
  int i;
  int J_local;
  int level_local;
  char *ext_local;
  char *ctype_local;
  int *length_local;
  double *coeff_local;
  
  __ptr = malloc((long)(siglength + 1) << 3);
  iVar1 = lf / 2;
  iVar2 = strcmp(ext,"per");
  det_len = level;
  if (iVar2 == 0) {
    iVar2 = strcmp(ctype,"appx");
    if (iVar2 == 0) {
      l = *length;
    }
    else {
      l = length[(J - level) + 1];
    }
    pvVar4 = malloc((long)(length[J] * 2 + lf * 2 + -1) << 3);
    for (k = 0; k < l; k = k + 1) {
      *(double *)((long)__ptr + (long)k * 8) = coeff[k];
    }
    for (; 0 < det_len; det_len = det_len + -1) {
      iVar2 = strcmp(ctype,"det");
      if ((iVar2 == 0) && (det_len == level)) {
        local_78 = hpr;
      }
      else {
        local_78 = lpr;
      }
      v = -2;
      t = -1;
      for (k = 0; k < l + iVar1 + -1; k = k + 1) {
        v = v + 2;
        t = t + 2;
        *(undefined8 *)((long)pvVar4 + (long)v * 8) = 0;
        *(undefined8 *)((long)pvVar4 + (long)t * 8) = 0;
        for (n = 0; n < iVar1; n = n + 1) {
          iVar2 = n * 2;
          if ((k - n < 0) || (l <= k - n)) {
            if ((k - n < l) || (l + lf + -1 <= k - n)) {
              if ((k - n < 0) &&
                 (iVar3 = k - n, iVar3 != -iVar1 && SBORROW4(iVar3,-iVar1) == iVar3 + iVar1 < 0)) {
                *(double *)((long)pvVar4 + (long)v * 8) =
                     local_78[iVar2] * *(double *)((long)__ptr + (long)((l + k) - n) * 8) +
                     *(double *)((long)pvVar4 + (long)v * 8);
                *(double *)((long)pvVar4 + (long)t * 8) =
                     local_78[iVar2 + 1] * *(double *)((long)__ptr + (long)((l + k) - n) * 8) +
                     *(double *)((long)pvVar4 + (long)t * 8);
              }
            }
            else {
              *(double *)((long)pvVar4 + (long)v * 8) =
                   local_78[iVar2] * *(double *)((long)__ptr + (long)((k - n) - l) * 8) +
                   *(double *)((long)pvVar4 + (long)v * 8);
              *(double *)((long)pvVar4 + (long)t * 8) =
                   local_78[iVar2 + 1] * *(double *)((long)__ptr + (long)((k - n) - l) * 8) +
                   *(double *)((long)pvVar4 + (long)t * 8);
            }
          }
          else {
            *(double *)((long)pvVar4 + (long)v * 8) =
                 local_78[iVar2] * *(double *)((long)__ptr + (long)(k - n) * 8) +
                 *(double *)((long)pvVar4 + (long)v * 8);
            *(double *)((long)pvVar4 + (long)t * 8) =
                 local_78[iVar2 + 1] * *(double *)((long)__ptr + (long)(k - n) * 8) +
                 *(double *)((long)pvVar4 + (long)t * 8);
          }
        }
      }
      for (N = lf / 2 + -1; N < l * 2 + lf / 2 + -1; N = N + 1) {
        *(undefined8 *)((long)__ptr + (long)((N - lf / 2) + 1) * 8) =
             *(undefined8 *)((long)pvVar4 + (long)N * 8);
      }
      if (det_len != 1) {
        l = length[(J - det_len) + 2];
      }
    }
    free(pvVar4);
  }
  else {
    iVar1 = strcmp(ext,"sym");
    if (iVar1 != 0) {
      printf("Signal extension can be either per or sym");
      exit(-1);
    }
    iVar1 = strcmp(ctype,"appx");
    if (iVar1 == 0) {
      l = *length;
    }
    else {
      l = length[(J - level) + 1];
    }
    pvVar4 = malloc((long)(length[J] * 2 + lf * 2 + -2) << 3);
    for (k = 0; k < l; k = k + 1) {
      *(double *)((long)__ptr + (long)k * 8) = coeff[k];
    }
    for (; 0 < det_len; det_len = det_len + -1) {
      iVar1 = strcmp(ctype,"det");
      if ((iVar1 == 0) && (det_len == level)) {
        local_78 = hpr;
      }
      else {
        local_78 = lpr;
      }
      v = -2;
      t = -1;
      for (l2 = 0; l2 < l; l2 = l2 + 1) {
        v = v + 2;
        t = t + 2;
        *(undefined8 *)((long)pvVar4 + (long)v * 8) = 0;
        *(undefined8 *)((long)pvVar4 + (long)t * 8) = 0;
        for (n = 0; n < lf / 2; n = n + 1) {
          if ((-1 < l2 - n) && (l2 - n < l)) {
            *(double *)((long)pvVar4 + (long)v * 8) =
                 local_78[n * 2] * *(double *)((long)__ptr + (long)(l2 - n) * 8) +
                 *(double *)((long)pvVar4 + (long)v * 8);
            *(double *)((long)pvVar4 + (long)t * 8) =
                 local_78[n * 2 + 1] * *(double *)((long)__ptr + (long)(l2 - n) * 8) +
                 *(double *)((long)pvVar4 + (long)t * 8);
          }
        }
      }
      for (N = lf + -2; SBORROW4(N,l * 2) != N + l * -2 < 0; N = N + 1) {
        *(undefined8 *)((long)__ptr + (long)((N - lf) + 2) * 8) =
             *(undefined8 *)((long)pvVar4 + (long)N * 8);
      }
      if (det_len != 1) {
        l = length[(J - det_len) + 2];
      }
    }
    free(pvVar4);
  }
  for (k = 0; k < siglength; k = k + 1) {
    reccoeff[k] = *(double *)((long)__ptr + (long)k * 8);
  }
  free(__ptr);
  return;
}

Assistant:

static void getDWTRecCoeff(double *coeff, int *length, const char *ctype, const char *ext, int level, int J, double *lpr,
	double *hpr, int lf, int siglength, double *reccoeff) {

	int i, j, k, det_len, N, l, m, n, v, t, l2;
	double *out, *X_lp, *filt;
	out = (double*)malloc(sizeof(double)* (siglength + 1));
	l2 = lf / 2;
	m = -2;
	n = -1;
	if (!strcmp(ext, "per")) {
		if (!strcmp((ctype), "appx")) {
			det_len = length[0];
		}
		else {
			det_len = length[J - level + 1];
		}

		N = 2 * length[J];

		X_lp = (double*)malloc(sizeof(double)* (N + 2 * lf - 1));

		for (i = 0; i < det_len; ++i) {
			out[i] = coeff[i];
		}

		for (j = level; j > 0; --j) {

			if (!strcmp((ctype), "det") && j == level) {
				filt = hpr;
			}
			else {
				filt = lpr;
			}

			m = -2;
			n = -1;

			for (i = 0; i < det_len + l2 - 1; ++i) {
				m += 2;
				n += 2;
				X_lp[m] = 0.0;
				X_lp[n] = 0.0;
				for (l = 0; l < l2; ++l) {
					t = 2 * l;
					if ((i - l) >= 0 && (i - l) < det_len) {
						X_lp[m] += filt[t] * out[i - l];
						X_lp[n] += filt[t + 1] * out[i - l];
					}
					else if ((i - l) >= det_len && (i - l) < det_len + lf - 1) {
						X_lp[m] += filt[t] * out[i - l - det_len];
						X_lp[n] += filt[t + 1] * out[i - l - det_len];
					}
					else if ((i - l) < 0 && (i - l) > -l2) {
						X_lp[m] += filt[t] * out[det_len + i - l];
						X_lp[n] += filt[t + 1] * out[det_len + i - l];
					}
				}
			}

			for (k = lf / 2 - 1; k < 2 * det_len + lf / 2 - 1; ++k) {
				out[k - lf / 2 + 1] = X_lp[k];
			}

			if (j != 1) {
				det_len = length[J - j + 2];
			}
		}

		free(X_lp);

	}
	else if (!strcmp(ext, "sym")) {
		if (!strcmp((ctype), "appx")) {
			det_len = length[0];
		}
		else {
			det_len = length[J - level + 1];
		}

		N = 2 * length[J] - 1;

		X_lp = (double*)malloc(sizeof(double)* (N + 2 * lf - 1));

		for (i = 0; i < det_len; ++i) {
			out[i] = coeff[i];
		}

		for (j = level; j > 0; --j) {

			if (!strcmp((ctype), "det") && j == level) {
				filt = hpr;
			}
			else {
				filt = lpr;
			}

			m = -2;
			n = -1;

			for (v = 0; v < det_len; ++v) {
				i = v;
				m += 2;
				n += 2;
				X_lp[m] = 0.0;
				X_lp[n] = 0.0;
				for (l = 0; l < lf / 2; ++l) {
					t = 2 * l;
					if ((i - l) >= 0 && (i - l) < det_len) {
						X_lp[m] += filt[t] * out[i - l];
						X_lp[n] += filt[t + 1] * out[i - l];
					}
				}
			}

			for (k = lf - 2; k < 2 * det_len; ++k) {
				out[k - lf + 2] = X_lp[k];
			}


			if (j != 1) {
				det_len = length[J - j + 2];
			}
		}

		free(X_lp);

	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}

	for (i = 0; i < siglength; ++i) {
		reccoeff[i] = out[i];
	}

	free(out);

}